

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumented_benchmark.cpp
# Opt level: O1

bool benchmarkMany(string *fn_name,uint32_t n,uint32_t m,uint32_t iterations,
                  pospopcnt_u16_method_type fn,bool verbose,bool test,bool tabular)

{
  undefined1 auVar1 [16];
  uint16_t *puVar2;
  pointer puVar3;
  pospopcnt_u16_method_type p_Var4;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  byte bVar11;
  byte bVar12;
  pointer pvVar13;
  string *psVar14;
  uint uVar15;
  result_type rVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  undefined4 in_register_00000034;
  char *__format;
  undefined7 in_register_00000089;
  ulong uVar21;
  bool bVar22;
  undefined4 uVar24;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *x;
  pointer pvVar25;
  double dVar26;
  bool bVar27;
  bool bVar28;
  ushort uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  double dVar38;
  undefined1 auVar39 [64];
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM6_Qb;
  vector<double,_std::allocator<double>_> avg;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  vdata;
  vector<unsigned_int,_std::allocator<unsigned_int>_> times;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> mins;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  allresults;
  uniform_int_distribution<int> dis;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> results;
  LinuxEvents<0> unified;
  random_device rd;
  mt19937 gen;
  vector<int,_std::allocator<int>_> local_2978;
  uint local_2960;
  allocator_type local_2959;
  double local_2958;
  double local_2950;
  undefined1 local_2948 [16];
  pointer local_2938;
  uint32_t local_292c;
  ulong local_2928;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  local_2920;
  value_type local_2908;
  undefined1 local_28e8 [16];
  uint *local_28d8;
  pospopcnt_u16_method_type local_28d0;
  undefined4 local_28c4;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_28c0;
  undefined1 local_28a8 [16];
  pointer local_2898;
  undefined8 local_2888;
  string *local_2880;
  undefined8 local_2878;
  param_type local_2870;
  undefined1 local_2868 [16];
  pointer local_2858;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  local_2848;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  local_2830;
  vector<int,_std::allocator<int>_> local_2818;
  LinuxEvents<0> local_2800;
  anon_union_5000_2_650ea050_for_random_device_0 local_2740;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  bool bVar23;
  
  local_2888 = CONCAT44(in_register_00000034,n);
  local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_28d0 = fn;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_2740.field_0,(ulong)n
             ,(allocator_type *)&local_13b8);
  local_2928 = (ulong)m;
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::vector(&local_2920,local_2928,(value_type *)&local_2740.field_0,(allocator_type *)&local_2800);
  if ((void *)CONCAT44(local_2740._M_mt._M_x[0]._4_4_,local_2740._M_mt._M_x[0]._0_4_) != (void *)0x0
     ) {
    operator_delete((void *)CONCAT44(local_2740._M_mt._M_x[0]._4_4_,local_2740._M_mt._M_x[0]._0_4_))
    ;
  }
  uVar24 = (undefined4)CONCAT71(in_register_00000089,verbose);
  if (verbose && !tabular) {
    printf("alignments: ");
    pvVar13 = local_2920.
              super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (pvVar25 = local_2920.
                   super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pvVar25 != pvVar13;
        pvVar25 = pvVar25 + 1) {
      printf("%d ",(ulong)(-*(int *)&(pvVar25->
                                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                     )._M_impl.super__Vector_impl_data._M_start &
                          *(uint *)&(pvVar25->
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    )._M_impl.super__Vector_impl_data._M_start));
    }
    putchar(10);
  }
  local_2740._M_mt._M_x[0]._0_4_ = 0;
  if (local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_2978,
               (iterator)
               local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_2740);
  }
  else {
    *local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0;
    local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_2740._M_mt._M_x[0]._0_4_ = 1;
  if (local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_2978,
               (iterator)
               local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_2740);
  }
  else {
    *local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 1;
    local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_2740._M_mt._M_x[0]._0_4_ = 5;
  if (local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_2978,
               (iterator)
               local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_2740);
  }
  else {
    *local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 5;
    local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_2740._M_mt._M_x[0]._0_4_ = 2;
  if (local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_2978,
               (iterator)
               local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_2740);
  }
  else {
    *local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 2;
    local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_2740._M_mt._M_x[0]._0_4_ = 3;
  if (local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_2978,
               (iterator)
               local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_2740);
  }
  else {
    *local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 3;
    local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_2740._M_mt._M_x[0]._0_4_ = 9;
  if (local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_2978,
               (iterator)
               local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_2740);
  }
  else {
    *local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 9;
    local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_2818,&local_2978);
  LinuxEvents<0>::LinuxEvents(&local_2800,&local_2818);
  if (local_2818.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2818.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_2868 = (undefined1  [16])0x0;
  local_2858 = (pointer)0x0;
  local_2898 = (pointer)0x0;
  local_28a8 = (undefined1  [16])0x0;
  local_28d8 = (uint *)0x0;
  local_28e8 = (undefined1  [16])0x0;
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::resize
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_2868,
             (long)local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  std::random_device::random_device((random_device *)&local_2740.field_0);
  uVar15 = std::random_device::_M_getval();
  local_2958 = (double)CONCAT71(local_2958._1_7_,test);
  local_13b8._M_x[0] = (unsigned_long)uVar15;
  lVar19 = 1;
  uVar21 = local_13b8._M_x[0];
  do {
    uVar21 = (ulong)(((uint)(uVar21 >> 0x1e) ^ (uint)uVar21) * 0x6c078965 + (int)lVar19);
    local_13b8._M_x[lVar19] = uVar21;
    lVar19 = lVar19 + 1;
  } while (lVar19 != 0x270);
  local_13b8._M_p = 0x270;
  local_2870._M_a = 0;
  local_2870._M_b = 0xffff;
  bVar28 = iterations != 0;
  local_292c = iterations;
  local_28c4 = uVar24;
  local_2880 = fn_name;
  if (iterations == 0) {
    bVar22 = true;
  }
  else {
    local_2950 = (double)(local_2928 * 0x18);
    bVar23 = true;
    bVar22 = true;
    local_2958 = (double)((ulong)local_2958 ^ 1);
    uVar15 = 0;
    do {
      local_2960 = uVar15;
      if (local_2920.
          super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_2920.
          super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar21 = 0;
        do {
          if (local_2920.
              super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar21].
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_2920.
              super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar21].
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start) {
            uVar20 = 0;
            do {
              rVar16 = std::uniform_int_distribution<int>::operator()
                                 ((uniform_int_distribution<int> *)&local_2870,&local_13b8,
                                  &local_2870);
              local_2920.
              super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar21].
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start[uVar20] = (unsigned_short)rVar16;
              uVar20 = uVar20 + 1;
            } while (uVar20 < (ulong)((long)local_2920.
                                            super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar21].
                                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_2920.
                                            super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar21].
                                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 1));
          }
          uVar21 = uVar21 + 1;
        } while (uVar21 < (ulong)(((long)local_2920.
                                         super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_2920.
                                         super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555));
      }
      local_2948 = (undefined1  [16])0x0;
      local_2938 = (pointer)0x0;
      local_2948._0_8_ = operator_new(0x40);
      local_2938 = (pointer)(local_2948._0_8_ + 0x40);
      auVar37 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
      *(undefined1 (*) [64])local_2948._0_8_ = auVar37;
      local_2948._8_8_ = local_2938;
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::vector(&local_28c0,local_2928,(value_type *)local_2948,(allocator_type *)&local_2908);
      if ((pointer)local_2948._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_2948._0_8_);
      }
      if (m != 0) {
        dVar26 = 0.0;
        do {
          puVar2 = *(uint16_t **)
                    ((long)&((local_2920.
                              super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                            _M_impl.super__Vector_impl_data._M_start + (long)dVar26);
          pospopcnt_u16_scalar_naive
                    (puVar2,(uint32_t)
                            ((ulong)(*(long *)((long)&((local_2920.
                                                                                                                
                                                  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish +
                                              (long)dVar26) - (long)puVar2) >> 1),
                     *(uint32_t **)
                      ((long)&((local_28c0.
                                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start + (long)dVar26));
          dVar26 = (double)((long)dVar26 + 0x18);
        } while (local_2950 != dVar26);
      }
      local_2908.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_2908.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2908.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2908.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)operator_new(0x40);
      local_2908.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)local_2908.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start + 0x40);
      auVar37 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
      *(undefined1 (*) [64])
       local_2908.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start = auVar37;
      local_2908.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_2908.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                *)local_2948,local_2928,&local_2908,&local_2959);
      if (local_2908.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2908.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      iVar17 = std::chrono::_V2::system_clock::now();
      LinuxEvents<0>::start(&local_2800);
      if (m != 0) {
        dVar26 = 0.0;
        do {
          puVar2 = *(uint16_t **)
                    ((long)&((local_2920.
                              super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                            _M_impl.super__Vector_impl_data._M_start + (long)dVar26);
          (*local_28d0)(puVar2,(uint32_t)
                               ((ulong)(*(long *)((long)&((local_2920.
                                                                                                                      
                                                  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish +
                                                 (long)dVar26) - (long)puVar2) >> 1),
                        *(uint32_t **)
                         ((long)&(((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  local_2948._0_8_)->_M_impl).super__Vector_impl_data._M_start +
                         (long)dVar26));
          dVar26 = (double)((long)dVar26 + 0x18);
        } while (local_2950 != dVar26);
      }
      LinuxEvents<0>::end(&local_2800,
                          (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                          local_2868);
      local_2878 = std::chrono::_V2::system_clock::now();
      if (m == 0) {
LAB_00119595:
        bVar27 = false;
        uVar15 = local_2960;
      }
      else {
        uVar21 = 0;
        uVar20 = 0;
        do {
          auVar37 = ZEXT864(uVar20);
          lVar19 = 0;
          do {
            auVar33 = vpmovzxdq_avx512f(*(undefined1 (*) [32])
                                         ((((pointer)(local_2948._0_8_ + uVar21 * 0x18))->
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          )._M_impl.super__Vector_impl_data._M_start + lVar19));
            auVar37 = vpaddq_avx512f(auVar37,auVar33);
            lVar19 = lVar19 + 8;
          } while (lVar19 != 0x10);
          auVar32 = vextracti64x4_avx512f(auVar37,1);
          auVar37 = vpaddq_avx512f(auVar37,ZEXT3264(auVar32));
          auVar5 = vpaddq_avx(auVar37._0_16_,auVar37._16_16_);
          auVar30 = vpshufd_avx(auVar5,0xee);
          auVar5 = vpaddq_avx(auVar5,auVar30);
          uVar20 = auVar5._0_8_;
          uVar21 = uVar21 + 1;
        } while (uVar21 != local_2928);
        if (uVar20 == 0) goto LAB_00119595;
        bVar27 = m != 0;
        if (m != 0) {
          uVar21 = 0;
          do {
            lVar19 = 0;
            do {
              uVar15 = local_28c0.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar21].
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar19];
              uVar18 = (((pointer)(local_2948._0_8_ + uVar21 * 0x18))->
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                       super__Vector_impl_data._M_start[lVar19];
              if (uVar15 != uVar18 && local_2958._0_1_ == '\0') {
                puts("bug:");
                printf("expected : ");
                print16(local_28c0.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar21].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start);
                printf("got      : ");
                print16((((pointer)(local_2948._0_8_ + uVar21 * 0x18))->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                        super__Vector_impl_data._M_start);
                goto LAB_0011958f;
              }
              bVar22 = bVar23;
              if (uVar15 != uVar18) {
                bVar22 = false;
              }
              lVar19 = lVar19 + 1;
              bVar23 = bVar22;
            } while (lVar19 != 0x10);
            uVar21 = uVar21 + 1;
            bVar27 = uVar21 < local_2928;
          } while (uVar21 != local_2928);
        }
LAB_0011958f:
        if (bVar27) goto LAB_00119595;
        std::
        vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
        ::push_back((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                     *)local_28a8,(value_type *)local_2868);
        uVar15 = local_2960;
        uVar18 = (int)local_2878 - iVar17;
        local_2908.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = uVar18;
        if ((uint *)local_28e8._8_8_ == local_28d8) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28e8,
                     (iterator)local_28e8._8_8_,(uint *)&local_2908);
        }
        else {
          *(uint *)local_28e8._8_8_ = uVar18;
          local_28e8._8_8_ = (uint *)(local_28e8._8_8_ + 4);
        }
        bVar27 = true;
      }
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)local_2948);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector(&local_28c0);
      if (!bVar27) break;
      uVar15 = uVar15 + 1;
      bVar28 = uVar15 < local_292c;
    } while (uVar15 != local_292c);
  }
  if (bVar28) {
    bVar22 = false;
  }
  else {
    if (local_28e8._0_8_ == local_28e8._8_8_) {
      uVar21 = 0;
    }
    else {
      auVar37 = vpbroadcastq_avx512f();
      uVar21 = ((ulong)(local_28e8._8_8_ + (-4 - local_28e8._0_8_)) >> 2) + 0x10 &
               0xfffffffffffffff0;
      auVar37 = vpsrlq_avx512f(auVar37,2);
      auVar39 = ZEXT1664((undefined1  [16])0x0);
      uVar20 = 0;
      auVar33 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar34 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        auVar35 = vmovdqa64_avx512f(auVar39);
        auVar39 = vpbroadcastq_avx512f();
        auVar36 = vporq_avx512f(auVar39,auVar33);
        auVar39 = vporq_avx512f(auVar39,auVar34);
        uVar6 = vpcmpuq_avx512f(auVar39,auVar37,2);
        bVar11 = (byte)uVar6;
        uVar6 = vpcmpuq_avx512f(auVar36,auVar37,2);
        bVar12 = (byte)uVar6;
        uVar29 = CONCAT11(bVar12,bVar11);
        auVar39 = vmovdqu32_avx512f(*(undefined1 (*) [64])(local_28e8._0_8_ + uVar20 * 4));
        auVar36._4_4_ = (uint)((byte)(uVar29 >> 1) & 1) * auVar39._4_4_;
        auVar36._0_4_ = (uint)(bVar11 & 1) * auVar39._0_4_;
        auVar36._8_4_ = (uint)((byte)(uVar29 >> 2) & 1) * auVar39._8_4_;
        auVar36._12_4_ = (uint)((byte)(uVar29 >> 3) & 1) * auVar39._12_4_;
        auVar36._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * auVar39._16_4_;
        auVar36._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * auVar39._20_4_;
        auVar36._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * auVar39._24_4_;
        auVar36._28_4_ = (uint)((byte)(uVar29 >> 7) & 1) * auVar39._28_4_;
        auVar36._32_4_ = (uint)(bVar12 & 1) * auVar39._32_4_;
        auVar36._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar39._36_4_;
        auVar36._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar39._40_4_;
        auVar36._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar39._44_4_;
        auVar36._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar39._48_4_;
        auVar36._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar39._52_4_;
        auVar36._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar39._56_4_;
        auVar36._60_4_ = (uint)(bVar12 >> 7) * auVar39._60_4_;
        auVar39 = vpaddd_avx512f(auVar36,auVar35);
        uVar20 = uVar20 + 0x10;
      } while (uVar21 != uVar20);
      auVar37 = vmovdqa32_avx512f(auVar39);
      auVar33._0_4_ = (uint)(bVar11 & 1) * auVar37._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar35._0_4_
      ;
      bVar28 = (bool)((byte)(uVar29 >> 1) & 1);
      auVar33._4_4_ = (uint)bVar28 * auVar37._4_4_ | (uint)!bVar28 * auVar35._4_4_;
      bVar28 = (bool)((byte)(uVar29 >> 2) & 1);
      auVar33._8_4_ = (uint)bVar28 * auVar37._8_4_ | (uint)!bVar28 * auVar35._8_4_;
      bVar28 = (bool)((byte)(uVar29 >> 3) & 1);
      auVar33._12_4_ = (uint)bVar28 * auVar37._12_4_ | (uint)!bVar28 * auVar35._12_4_;
      bVar28 = (bool)((byte)(uVar29 >> 4) & 1);
      auVar33._16_4_ = (uint)bVar28 * auVar37._16_4_ | (uint)!bVar28 * auVar35._16_4_;
      bVar28 = (bool)((byte)(uVar29 >> 5) & 1);
      auVar33._20_4_ = (uint)bVar28 * auVar37._20_4_ | (uint)!bVar28 * auVar35._20_4_;
      bVar28 = (bool)((byte)(uVar29 >> 6) & 1);
      auVar33._24_4_ = (uint)bVar28 * auVar37._24_4_ | (uint)!bVar28 * auVar35._24_4_;
      bVar28 = (bool)((byte)(uVar29 >> 7) & 1);
      auVar33._28_4_ = (uint)bVar28 * auVar37._28_4_ | (uint)!bVar28 * auVar35._28_4_;
      auVar33._32_4_ =
           (uint)(bVar12 & 1) * auVar37._32_4_ | (uint)!(bool)(bVar12 & 1) * auVar35._32_4_;
      bVar28 = (bool)(bVar12 >> 1 & 1);
      auVar33._36_4_ = (uint)bVar28 * auVar37._36_4_ | (uint)!bVar28 * auVar35._36_4_;
      bVar28 = (bool)(bVar12 >> 2 & 1);
      auVar33._40_4_ = (uint)bVar28 * auVar37._40_4_ | (uint)!bVar28 * auVar35._40_4_;
      bVar28 = (bool)(bVar12 >> 3 & 1);
      auVar33._44_4_ = (uint)bVar28 * auVar37._44_4_ | (uint)!bVar28 * auVar35._44_4_;
      bVar28 = (bool)(bVar12 >> 4 & 1);
      auVar33._48_4_ = (uint)bVar28 * auVar37._48_4_ | (uint)!bVar28 * auVar35._48_4_;
      bVar28 = (bool)(bVar12 >> 5 & 1);
      auVar33._52_4_ = (uint)bVar28 * auVar37._52_4_ | (uint)!bVar28 * auVar35._52_4_;
      bVar28 = (bool)(bVar12 >> 6 & 1);
      auVar33._56_4_ = (uint)bVar28 * auVar37._56_4_ | (uint)!bVar28 * auVar35._56_4_;
      auVar33._60_4_ =
           (uint)(bVar12 >> 7) * auVar37._60_4_ | (uint)!(bool)(bVar12 >> 7) * auVar35._60_4_;
      auVar32 = vextracti64x4_avx512f(auVar33,1);
      auVar37 = vpaddd_avx512f(auVar33,ZEXT3264(auVar32));
      auVar5 = vpaddd_avx(auVar37._0_16_,auVar37._16_16_);
      auVar30 = vpshufd_avx(auVar5,0xee);
      auVar5 = vpaddd_avx(auVar5,auVar30);
      auVar30 = vpshufd_avx(auVar5,0x55);
      auVar5 = vpaddd_avx(auVar5,auVar30);
      uVar21 = CONCAT44((int)(uVar21 >> 0x20),auVar5._0_4_);
    }
    lVar19 = local_28e8._8_8_ - local_28e8._0_8_;
    std::
    vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
    ::vector(&local_2830,
             (vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
              *)local_28a8);
    compute_mins((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)&local_28c0,
                 &local_2830);
    std::
    vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
    ::~vector(&local_2830);
    std::
    vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
    ::vector(&local_2848,
             (vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
              *)local_28a8);
    compute_averages((vector<double,_std::allocator<double>_> *)local_2948,&local_2848);
    std::
    vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
    ::~vector(&local_2848);
    psVar14 = local_2880;
    iVar17 = (int)local_2888;
    auVar5._8_8_ = in_XMM6_Qb;
    auVar5._0_8_ = in_XMM6_Qa;
    auVar5 = vcvtusi2sd_avx512f(auVar5,iVar17 * 2);
    p_Var4 = (pospopcnt_u16_method_type)(auVar5._0_8_ * 9.5367431640625e-07);
    if (tabular) {
      if (local_292c != 0) {
        auVar7._8_8_ = in_XMM6_Qb;
        auVar7._0_8_ = in_XMM6_Qa;
        auVar5 = vcvtusi2sd_avx512f(auVar7,m * iVar17);
        local_2958 = auVar5._0_8_;
        uVar21 = (ulong)local_292c;
        uVar20 = 0;
        local_28d0 = p_Var4;
        do {
          auVar8._8_8_ = in_XMM6_Qb;
          auVar8._0_8_ = in_XMM6_Qa;
          auVar5 = vcvtusi2sd_avx512f(auVar8,*(pointer)(local_28e8._0_8_ + uVar20 * 4));
          local_2950 = (double)local_28d0 / (auVar5._0_8_ / 1000000000.0);
          printf("%s\t%u\t%d\t",(psVar14->_M_dataplus)._M_p,local_2888,uVar20 & 0xffffffff);
          auVar30 = vcvtuqq2pd_avx512vl(*(undefined1 (*) [16])
                                         (((pointer)(local_28a8._0_8_ + uVar20 * 0x18))->
                                         super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                         )._M_impl.super__Vector_impl_data._M_start);
          auVar5 = vshufpd_avx(auVar30,auVar30,1);
          printf("%4.2f\t%4.3f\t%4.3f\t",auVar5._0_8_ / auVar30._0_8_,auVar30._0_8_ / local_2958,
                 auVar5._0_8_ / local_2958);
          puVar3 = (((pointer)(local_28a8._0_8_ + uVar20 * 0x18))->
                   super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          printf("%llu\t%llu\t%llu\t%llu\t%llu\t",*puVar3,puVar3[1],puVar3[2],puVar3[3],puVar3[4]);
          printf("%u\t%4.2f\n",local_2950,(ulong)*(uint *)(local_28e8._0_8_ + uVar20 * 4));
          uVar20 = uVar20 + 1;
        } while (uVar20 != uVar21);
      }
    }
    else {
      if ((char)local_28c4 == '\0') {
        auVar30._8_8_ = in_XMM6_Qb;
        auVar30._0_8_ = in_XMM6_Qa;
        auVar30 = vcvtusi2sd_avx512f(auVar30,((local_28c0.
                                               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             )._M_impl.super__Vector_impl_data._M_start);
        auVar31._8_8_ = in_XMM6_Qb;
        auVar31._0_8_ = in_XMM6_Qa;
        auVar5 = vcvtusi2sd_avx512f(auVar31,m * iVar17);
        dVar26 = auVar30._0_8_ / auVar5._0_8_;
        auVar10._8_8_ = in_XMM6_Qb;
        auVar10._0_8_ = in_XMM6_Qa;
        auVar30 = vcvtusi2sd_avx512f(auVar10,local_28c0.
                                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[1].
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        dVar38 = auVar30._0_8_ / auVar5._0_8_;
        __format = "cycles per 16-bit word:  %4.3f; ref cycles per 16-bit word: %4.3f \n";
      }
      else {
        local_2958 = (double)(uVar21 / (ulong)(lVar19 >> 2));
        local_2950 = (double)p_Var4 / (local_2958 / 1000000000.0);
        auVar1._0_8_ = ((local_28c0.
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                       super__Vector_impl_data._M_start;
        auVar1._8_8_ = ((local_28c0.
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
        auVar31 = vcvtuqq2pd_avx512vl(auVar1);
        auVar5 = vshufpd_avx(auVar31,auVar31,1);
        auVar9._8_8_ = in_XMM6_Qb;
        auVar9._0_8_ = in_XMM6_Qa;
        auVar30 = vcvtusi2sd_avx512f(auVar9,m * iVar17);
        printf("instructions per cycle %4.2f, cycles per 16-bit word:  %4.3f, instructions per 16-bit word %4.3f \n"
               ,auVar5._0_8_ / auVar31._0_8_,auVar31._0_8_ / auVar30._0_8_,
               auVar5._0_8_ / auVar30._0_8_);
        printf("min: %8llu cycles, %8llu instructions, \t%8llu branch mis., %8llu cache ref., %8llu cache mis.\n"
               ,((local_28c0.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start,
               ((local_28c0.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish,
               ((local_28c0.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage,
               local_28c0.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1].
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_28c0.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1].
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish);
        printf("avg: %8.1f cycles, %8.1f instructions, \t%8.1f branch mis., %8.1f cache ref., %8.1f cache mis.\n"
               ,(((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_2948._0_8_)->
                _M_impl).super__Vector_impl_data._M_start,
               (((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_2948._0_8_)->
               _M_impl).super__Vector_impl_data._M_finish,
               (((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_2948._0_8_)->
               _M_impl).super__Vector_impl_data._M_end_of_storage,
               (((pointer)(local_2948._0_8_ + 0x18))->
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (((pointer)(local_2948._0_8_ + 0x18))->
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish);
        __format = "avg time: %f ns, %4.2f mb/s\n";
        dVar26 = local_2958;
        dVar38 = local_2950;
      }
      printf(__format,dVar26,dVar38);
    }
    if ((pointer)local_2948._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_2948._0_8_);
    }
    if (local_28c0.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_28c0.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  std::random_device::_M_fini();
  if ((pointer)local_28e8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_28e8._0_8_);
  }
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
             *)local_28a8);
  if ((pointer)local_2868._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_2868._0_8_);
  }
  LinuxEvents<0>::~LinuxEvents(&local_2800);
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::~vector(&local_2920);
  if (local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar22;
}

Assistant:

bool benchmarkMany(const std::string& fn_name, uint32_t n, uint32_t m, uint32_t iterations, pospopcnt_u16_method_type fn, bool verbose, bool test, bool tabular) {
    std::vector<int> evts;
#ifdef ALIGN
    std::vector<std::vector<uint16_t,AlignedSTLAllocator<uint16_t,64>>> vdata(m, std::vector<uint16_t,AlignedSTLAllocator<uint16_t,64>>(n));
#else
    std::vector<std::vector<uint16_t>> vdata(m, std::vector<uint16_t>(n));
#endif
#ifdef ALIGN
    for(auto & x : vdata) {
      assert(get_alignment(x.data()) == 64);
    }
#endif
    if(verbose && !tabular) {
      printf("alignments: ");
      for(auto & x : vdata) {
        printf("%d ", get_alignment(x.data()));
      }
      printf("\n");
    }    
    evts.push_back(PERF_COUNT_HW_CPU_CYCLES);
    evts.push_back(PERF_COUNT_HW_INSTRUCTIONS);
    evts.push_back(PERF_COUNT_HW_BRANCH_MISSES);
    evts.push_back(PERF_COUNT_HW_CACHE_REFERENCES);
    evts.push_back(PERF_COUNT_HW_CACHE_MISSES);
    evts.push_back(PERF_COUNT_HW_REF_CPU_CYCLES);
    LinuxEvents<PERF_TYPE_HARDWARE> unified(evts);
    std::vector<unsigned long long> results; // tmp buffer
    std::vector< std::vector<unsigned long long> > allresults;
    std::vector<uint32_t> times;
    results.resize(evts.size());
    
    std::random_device rd;
    std::mt19937 gen(rd());
    std::uniform_int_distribution<> dis(0, 0xFFFF);

    bool isok = true;
    for (uint32_t i = 0; i < iterations; i++) {
        for (size_t k = 0; k < vdata.size(); k++) {
            for(size_t k2 = 0; k2 < vdata[k].size() ; k2++) { 
               vdata[k][k2] = dis(gen); // random init.
            }
        }
        std::vector<std::vector<uint32_t>> correctflags(m,std::vector<uint32_t>(16));
        for (size_t k = 0; k < m; k++) {
          pospopcnt_u16_scalar_naive(vdata[k].data(), vdata[k].size(), correctflags[k].data()); // this is our gold standard
        }
        std::vector<std::vector<uint32_t>> flags(m,std::vector<uint32_t>(16));
        
        const clockdef t1 = std::chrono::high_resolution_clock::now();
        unified.start();
        for (size_t k = 0; k < m ; k++) {
          fn(vdata[k].data(), vdata[k].size(), flags[k].data());
        }
        unified.end(results);
        const clockdef t2 = std::chrono::high_resolution_clock::now();

        uint64_t tot_obs = 0;
        for (size_t km = 0; km < m; ++km)
          for (size_t k = 0; k < 16; ++k) tot_obs += flags[km][k];
        if (tot_obs == 0) { // when a method is not supported it returns all zero
            return false;
        }
        for (size_t km = 0; km < m; ++km) {
          for (size_t k = 0; k < 16; k++) {
            if (correctflags[km][k] != flags[km][k]) {
                if (test) {
                    printf("bug:\n");
                    printf("expected : ");
                    print16(correctflags[km].data());
                    printf("got      : ");
                    print16(flags[km].data());
                    return false;
                } else {
                    isok = false;
                }
            }
          }
        }
        allresults.push_back(results);

        const auto time_span = std::chrono::duration_cast<std::chrono::nanoseconds>(t2 - t1);
        times.push_back(time_span.count());
    }

    uint32_t tot_time = std::accumulate(times.begin(), times.end(), 0);
    double mean_time = tot_time / times.size();

    std::vector<unsigned long long> mins = compute_mins(allresults);
    std::vector<double> avg = compute_averages(allresults);

    double throughput = ((2*n) / (1024*1024.0)) / (mean_time / 1000000000.0);
    
    if (tabular) {
        for (int i = 0; i < iterations; ++i) {
            throughput = ((2*n) / (1024*1024.0)) / (times[i] / 1000000000.0);
            printf("%s\t%u\t%d\t", fn_name.c_str(), n, i);
            printf("%4.2f\t%4.3f\t%4.3f\t",
                    double(allresults[i][1]) / allresults[i][0], double(allresults[i][0]) / (n*m), double(allresults[i][1]) / (n*m));
            printf("%llu\t%llu\t%llu\t%llu\t%llu\t",
                    allresults[i][0], allresults[i][1], allresults[i][2], allresults[i][3], allresults[i][4]);
            printf("%u\t%4.2f\n", times[i], throughput);
        }
    } else if (verbose) {
        printf("instructions per cycle %4.2f, cycles per 16-bit word:  %4.3f, "
               "instructions per 16-bit word %4.3f \n",
                double(mins[1]) / mins[0], double(mins[0]) / (n*m), double(mins[1]) / (n*m));
        // first we display mins
        printf("min: %8llu cycles, %8llu instructions, \t%8llu branch mis., %8llu "
               "cache ref., %8llu cache mis.\n",
                mins[0], mins[1], mins[2], mins[3], mins[4]);
        printf("avg: %8.1f cycles, %8.1f instructions, \t%8.1f branch mis., %8.1f "
               "cache ref., %8.1f cache mis.\n",
                avg[0], avg[1], avg[2], avg[3], avg[4]);
        printf("avg time: %f ns, %4.2f mb/s\n", mean_time, throughput);
    } else {
        printf("cycles per 16-bit word:  %4.3f; ref cycles per 16-bit word: %4.3f \n", double(mins[0]) / (n*m), double(mins[5]) / (n*m));
    }

    return isok;
}